

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::NamedParamAssignmentSyntax::getChild(NamedParamAssignmentSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  Token token_01;
  Token token_02;
  undefined8 in_RDX;
  ConstTokenOrSyntax *in_RSI;
  Info *in_RDI;
  SyntaxNode *in_stack_ffffffffffffff88;
  
  switch(in_RDX) {
  case 0:
    token.info = in_RDI;
    token._0_8_ = in_stack_ffffffffffffff88;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x230656,token);
    break;
  case 1:
    token_00.info = in_RDI;
    token_00._0_8_ = in_stack_ffffffffffffff88;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x230686,token_00);
    break;
  case 2:
    token_01.info = in_RDI;
    token_01._0_8_ = in_stack_ffffffffffffff88;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x2306b3,token_01);
    break;
  case 3:
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)in_RDI,in_stack_ffffffffffffff88);
    break;
  case 4:
    token_02.info = in_RDI;
    token_02._0_8_ = in_stack_ffffffffffffff88;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x2306f5,token_02);
    break;
  default:
    ConstTokenOrSyntax::ConstTokenOrSyntax(in_RSI,in_RDI);
  }
  return (ConstTokenOrSyntax *)in_RDI;
}

Assistant:

ConstTokenOrSyntax NamedParamAssignmentSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return dot;
        case 1: return name;
        case 2: return openParen;
        case 3: return expr;
        case 4: return closeParen;
        default: return nullptr;
    }
}